

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O2

int __thiscall
OpenMD::LegendreCorrFuncZ::computeProperty1(LegendreCorrFuncZ *this,int frame,StuntDouble *sd)

{
  pointer pvVar1;
  int zBin;
  Vector3d pos;
  RotMat3x3d A;
  
  StuntDouble::getA(&A,sd);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back((this->rotMats_).
            super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + frame,&A);
  StuntDouble::getPos(&pos,sd);
  if ((((this->super_ObjectACF<OpenMD::Vector3<double>_>).
        super_AutoCorrFunc<OpenMD::Vector3<double>_>.super_TimeCorrFunc<OpenMD::Vector3<double>_>.
       info_)->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\x01')
  {
    Snapshot::wrapVector
              ((this->super_ObjectACF<OpenMD::Vector3<double>_>).
               super_AutoCorrFunc<OpenMD::Vector3<double>_>.
               super_TimeCorrFunc<OpenMD::Vector3<double>_>.currentSnapshot_,&pos);
  }
  zBin = (int)(((this->halfBoxZ_ + pos.super_Vector<double,_3U>.data_[(uint)this->axis_]) *
               (double)this->nZBins_) / this->boxZ_);
  std::vector<int,_std::allocator<int>_>::push_back
            ((this->zbin_).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + frame,&zBin);
  pvVar1 = (this->rotMats_).
           super__Vector_base<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (int)(((long)*(pointer *)
                       ((long)&pvVar1[frame].
                               super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                               ._M_impl.super__Vector_impl_data + 8) -
               *(long *)&pvVar1[frame].
                         super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                         ._M_impl.super__Vector_impl_data) / 0x48) + -1;
}

Assistant:

int LegendreCorrFuncZ::computeProperty1(int frame, StuntDouble* sd) {
    RotMat3x3d A = sd->getA();
    rotMats_[frame].push_back(A);

    Vector3d pos = sd->getPos();
    if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
      currentSnapshot_->wrapVector(pos);
    int zBin = int(nZBins_ * (halfBoxZ_ + pos[axis_]) / boxZ_);
    zbin_[frame].push_back(zBin);

    return rotMats_[frame].size() - 1;
  }